

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<TPZBlock::TNode>::Resize(TPZVec<TPZBlock::TNode> *this,int64_t newsize)

{
  ostream *poVar1;
  int64_t *piVar2;
  long lVar3;
  TNode *pTVar4;
  long lVar5;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar5 = this->fNElements;
  if (lVar5 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar4 = this->fStore;
      if (pTVar4 != (TNode *)0x0) {
        lVar5._0_4_ = pTVar4[-1].pos;
        lVar5._4_4_ = pTVar4[-1].dim;
        operator_delete__(&pTVar4[-1].pos,lVar5 << 4 | 8);
      }
      this->fStore = (TNode *)0x0;
    }
    else {
      piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3c != 0) | newsize * 0x10 | 8)
      ;
      *piVar2 = newsize;
      pTVar4 = (TNode *)(piVar2 + 1);
      do {
        (pTVar4->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TNode_01897ef8;
        pTVar4->pos = 0;
        pTVar4->dim = 0;
        pTVar4 = pTVar4 + 1;
      } while (pTVar4 != (TNode *)(piVar2 + newsize * 2 + 1));
      if (newsize <= lVar5) {
        lVar5 = newsize;
      }
      if (0 < lVar5) {
        pTVar4 = this->fStore;
        lVar3 = 0;
        do {
          *(undefined8 *)((long)piVar2 + lVar3 + 0x10) = *(undefined8 *)((long)&pTVar4->pos + lVar3)
          ;
          lVar3 = lVar3 + 0x10;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      pTVar4 = this->fStore;
      if (pTVar4 != (TNode *)0x0) {
        lVar3._0_4_ = pTVar4[-1].pos;
        lVar3._4_4_ = pTVar4[-1].dim;
        operator_delete__(&pTVar4[-1].pos,lVar3 << 4 | 8);
      }
      this->fStore = (TNode *)(piVar2 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}